

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O3

void pospopcnt_u8_avx2_adder_forest(uint8_t *data,size_t len,uint32_t *flags)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint32_t pospopcnt16 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  
  local_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  uStack_30 = 0;
  pospopcnt_u16_avx2_adder_forest((uint16_t *)data,(uint32_t)(len >> 1),(uint32_t *)&local_68);
  auVar2._8_8_ = uStack_40;
  auVar2._0_8_ = uStack_48;
  auVar2._16_8_ = uStack_38;
  auVar2._24_8_ = uStack_30;
  auVar3._8_8_ = uStack_60;
  auVar3._0_8_ = local_68;
  auVar3._16_8_ = uStack_58;
  auVar3._24_8_ = uStack_50;
  auVar3 = vpaddd_avx2(auVar2,auVar3);
  *(undefined1 (*) [32])flags = auVar3;
  if ((len & 1) != 0) {
    auVar3 = vpbroadcastd_avx512vl();
    auVar3 = vpsrlvd_avx2(auVar3,_DAT_00119140);
    auVar1._8_4_ = 1;
    auVar1._0_8_ = 0x100000001;
    auVar1._12_4_ = 1;
    auVar1._16_4_ = 1;
    auVar1._20_4_ = 1;
    auVar1._24_4_ = 1;
    auVar1._28_4_ = 1;
    auVar3 = vpandd_avx512vl(auVar3,auVar1);
    auVar3 = vpaddd_avx2(auVar3,*(undefined1 (*) [32])flags);
    *(undefined1 (*) [32])flags = auVar3;
  }
  return;
}

Assistant:

pospopcnt_u16_stub(pospopcnt_u16_avx2_lemire)
pospopcnt_u16_stub(pospopcnt_u16_avx2_lemire2)
pospopcnt_u16_stub(pospopcnt_u16_avx2_blend_popcnt)
pospopcnt_u16_stub(pospopcnt_u16_avx2_blend_popcnt_unroll4)
pospopcnt_u16_stub(pospopcnt_u16_avx2_blend_popcnt_unroll8)
pospopcnt_u16_stub(pospopcnt_u16_avx2_blend_popcnt_unroll16)
pospopcnt_u16_stub(pospopcnt_u16_avx2_adder_forest)
pospopcnt_u16_stub(pospopcnt_u16_avx2_harley_seal)
pospopcnt_u16_stub(pospopcnt_u16_avx2_harley_seal_improved)
pospopcnt_u8_stub(pospopcnt_u8_avx2_lemire)
pospopcnt_u8_stub(pospopcnt_u8_avx2_lemire2)
pospopcnt_u8_stub(pospopcnt_u8_avx2_blend_popcnt)
pospopcnt_u8_stub(pospopcnt_u8_avx2_blend_popcnt_unroll4)
pospopcnt_u8_stub(pospopcnt_u8_avx2_blend_popcnt_unroll8)
pospopcnt_u8_stub(pospopcnt_u8_avx2_blend_popcnt_unroll16)
pospopcnt_u8_stub(pospopcnt_u8_avx2_adder_forest)
pospopcnt_u8_stub(pospopcnt_u8_avx2_harley_seal)
pospopcnt_u8_stub(pospopcnt_u8_avx2_popcnt4bit)
pospopcnt_u8_stub(pospopcnt_u8_avx2_horizreduce)
pospopcnt_u32_stub(pospopcnt_u32_avx2_harley_seal)
pospopcnt_u32_stub(pospopcnt_u32_avx2_harley_seal_improved)
#endif

#if POSPOPCNT_SIMD_VERSION >= 3
int pospopcnt_u16_sse_blend_popcnt(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 2 <= n_cycles; i += 2) {
        __m128i v0 = _mm_loadu_si128(data_vectors + i + 0);
        __m128i v1 = _mm_loadu_si128(data_vectors + i + 1);

        __m128i input0 = _mm_or_si128(_mm_and_si128(v0, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v1, 8));
        __m128i input1 = _mm_or_si128(_mm_and_si128(v0, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v1, 8));
        
        for (int i = 0; i < 8; ++i) {
            flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input0));
            flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input1));
            input0 = _mm_add_epi8(input0, input0);
            input1 = _mm_add_epi8(input1, input1);
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }
    
    return 0;
}